

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UInt64Type.cpp
# Opt level: O0

void __thiscall hdc::UInt64Type::UInt64Type(UInt64Type *this,Token *token)

{
  Token *token_local;
  UInt64Type *this_local;
  
  PrimitiveType::PrimitiveType(&this->super_PrimitiveType);
  (this->super_PrimitiveType).super_Type.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR_accept_00220728;
  Token::Token(&this->token);
  Token::operator=(&this->token,token);
  (this->super_PrimitiveType).super_Type.super_ASTNode.kind = AST_UINT64_TYPE;
  return;
}

Assistant:

UInt64Type::UInt64Type(Token& token) {
    this->token = token;
    this->kind = AST_UINT64_TYPE;
}